

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O3

string * __thiscall
despot::SemiChainBelief::text_abi_cxx11_(string *__return_storage_ptr__,SemiChainBelief *this)

{
  pointer pvVar1;
  char cVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  ostringstream oss;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((this->alpha_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->alpha_).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)uVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ->",3);
      pvVar1 = (this->alpha_).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
          std::ostream::_M_insert<double>
                    (*(double *)
                      (*(long *)&(this->alpha_).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar5].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar4 * 8));
          uVar4 = uVar4 + 1;
          pvVar1 = (this->alpha_).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar4 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar5].
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar5].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data >> 3));
      }
      cVar2 = (char)(ostringstream *)local_1a8;
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      uVar4 = ((long)(this->alpha_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->alpha_).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar5 <= uVar4 && uVar4 - uVar5 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string SemiChainBelief::text() const {
	ostringstream oss;
	for (int a = 0; a < alpha_.size(); a++) {
		oss << a << " ->";
		for (int r = 0; r < alpha_[a].size(); r++)
			oss << " " << alpha_[a][r];
		oss << endl;
	}
	return oss.str();
}